

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O0

int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vSuper,int fFirst)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  bool local_31;
  int local_30;
  int i;
  int RetValue2;
  int RetValue1;
  int fFirst_local;
  Vec_Ptr_t *vSuper_local;
  Abc_Obj_t *pNode_local;
  
  for (local_30 = 0; local_30 < vSuper->nSize; local_30 = local_30 + 1) {
    if ((Abc_Obj_t *)vSuper->pArray[local_30] == pNode) {
      return 1;
    }
  }
  if ((fFirst == 0) &&
     (((*(uint *)&pNode->field_0x14 >> 8 & 1) == 0 || (iVar1 = Abc_ObjIsNode(pNode), iVar1 == 0))))
  {
    Vec_PtrPush(vSuper,pNode);
    pNode_local._4_4_ = 0;
  }
  else {
    iVar1 = Abc_ObjIsComplement(pNode);
    if (iVar1 != 0) {
      __assert_fail("!Abc_ObjIsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                    ,0x195,"int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
    iVar1 = Abc_ObjIsNode(pNode);
    if (iVar1 == 0) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                    ,0x196,"int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
    if ((*(uint *)&pNode->field_0x14 >> 8 & 1) == 0) {
      __assert_fail("pNode->fExor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                    ,0x197,"int Abc_NodeBalanceConeExor_rec(Abc_Obj_t *, Vec_Ptr_t *, int)");
    }
    pAVar3 = Abc_ObjFanin0(pNode);
    pAVar3 = Abc_ObjFanin0(pAVar3);
    iVar1 = Abc_NodeBalanceConeExor_rec(pAVar3,vSuper,0);
    pAVar3 = Abc_ObjFanin0(pNode);
    pAVar3 = Abc_ObjFanin1(pAVar3);
    iVar2 = Abc_NodeBalanceConeExor_rec(pAVar3,vSuper,0);
    if ((iVar1 == -1) || (iVar2 == -1)) {
      pNode_local._4_4_ = 0xffffffff;
    }
    else {
      local_31 = iVar1 != 0 || iVar2 != 0;
      pNode_local._4_4_ = (uint)local_31;
    }
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NodeBalanceConeExor_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vSuper, int fFirst )
{
    int RetValue1, RetValue2, i;
    // check if the node occurs in the same polarity
    for ( i = 0; i < vSuper->nSize; i++ )
        if ( vSuper->pArray[i] == pNode )
            return 1;
    // if the new node is complemented or a PI, another gate begins
    if ( !fFirst && (!pNode->fExor || !Abc_ObjIsNode(pNode)) )
    {
        Vec_PtrPush( vSuper, pNode );
        return 0;
    }
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_ObjIsNode(pNode) );
    assert( pNode->fExor );
    // go through the branches
    RetValue1 = Abc_NodeBalanceConeExor_rec( Abc_ObjFanin0(Abc_ObjFanin0(pNode)), vSuper, 0 );
    RetValue2 = Abc_NodeBalanceConeExor_rec( Abc_ObjFanin1(Abc_ObjFanin0(pNode)), vSuper, 0 );
    if ( RetValue1 == -1 || RetValue2 == -1 )
        return -1;
    // return 1 if at least one branch has a duplicate
    return RetValue1 || RetValue2;
}